

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O1

void __thiscall DPolyobjInterpolation::Interpolate(DPolyobjInterpolation *this,double smoothratio)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  FPolyObj *this_00;
  vertex_t **ppvVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  byte bVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  
  this_00 = this->poly;
  uVar10 = (ulong)(this_00->Vertices).Count;
  if (uVar10 == 0) {
    bVar9 = 0;
  }
  else {
    ppvVar5 = (this_00->Vertices).Array;
    pdVar6 = (this->oldverts).Array;
    pdVar7 = (this->bakverts).Array;
    uVar12 = 0;
    bVar9 = 0;
    do {
      pdVar8 = *(double **)((long)ppvVar5 + uVar12 * 4);
      dVar1 = *pdVar8;
      pdVar7[uVar12 & 0xffffffff] = dVar1;
      dVar2 = pdVar8[1];
      uVar11 = (int)uVar12 + 1;
      pdVar7[uVar11] = dVar2;
      dVar3 = pdVar6[uVar12 & 0xffffffff];
      if ((dVar1 != dVar3) || (NAN(dVar1) || NAN(dVar3))) {
LAB_00690686:
        dVar4 = pdVar6[uVar11];
        *pdVar8 = (dVar1 - dVar3) * smoothratio + dVar3;
        pdVar8[1] = (dVar2 - dVar4) * smoothratio + dVar4;
        bVar9 = 1;
      }
      else if ((dVar2 != pdVar6[uVar11]) || (NAN(dVar2) || NAN(pdVar6[uVar11]))) goto LAB_00690686;
      uVar12 = uVar12 + 2;
    } while (uVar10 * 2 != uVar12);
  }
  if (!(bool)((this->super_DInterpolation).refcount != 0 | bVar9)) {
    (*(this->super_DInterpolation).super_DObject._vptr_DObject[4])(this);
    return;
  }
  dVar1 = (this_00->CenterSpot).pos.X;
  this->bakcx = dVar1;
  dVar2 = (this_00->CenterSpot).pos.Y;
  this->bakcy = dVar2;
  (this_00->CenterSpot).pos.X = (dVar1 - this->oldcx) * smoothratio + dVar1;
  (this_00->CenterSpot).pos.Y = (dVar2 - this->oldcy) * smoothratio + dVar2;
  FPolyObj::ClearSubsectorLinks(this_00);
  return;
}

Assistant:

void DPolyobjInterpolation::Interpolate(double smoothratio)
{
	bool changed = false;
	for(unsigned int i = 0; i < poly->Vertices.Size(); i++)
	{
		bakverts[i*2  ] = poly->Vertices[i]->fX();
		bakverts[i*2+1] = poly->Vertices[i]->fY();

		if (bakverts[i * 2] != oldverts[i * 2] || bakverts[i * 2 + 1] != oldverts[i * 2 + 1])
		{
			changed = true;
			poly->Vertices[i]->set(
				oldverts[i * 2] + (bakverts[i * 2] - oldverts[i * 2]) * smoothratio,
				oldverts[i * 2 + 1] + (bakverts[i * 2 + 1] - oldverts[i * 2 + 1]) * smoothratio);
		}
	}
	if (refcount == 0 && !changed)
	{
		Destroy();
	}
	else
	{
		bakcx = poly->CenterSpot.pos.X;
		bakcy = poly->CenterSpot.pos.Y;
		poly->CenterSpot.pos.X = bakcx + (bakcx - oldcx) * smoothratio;
		poly->CenterSpot.pos.Y = bakcy + (bakcy - oldcy) * smoothratio;

		poly->ClearSubsectorLinks();
	}
}